

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O0

void anon_unknown.dwarf_18c49e::generateRandomFile(int partCount,string *fn)

{
  Array2D<unsigned_int> *pAVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *pAVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  ostream *poVar11;
  size_type sVar12;
  reference __a;
  reference __b;
  char *pcVar13;
  reference pvVar14;
  reference pvVar15;
  OutputPart *this;
  TiledOutputPart *this_00;
  Array2D<Imf_3_2::FrameBuffer> *pAVar16;
  ThreadPool *this_01;
  reference ppvVar17;
  int in_EDI;
  ulong uVar18;
  int i_3;
  int i_2;
  vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  list;
  ThreadPool *threadPool;
  TaskGroup taskGroup;
  FrameBuffer *frameBuffer_1;
  int h;
  int w;
  int yLevel;
  int xLevel;
  int numYLevels;
  int numXLevels;
  TiledOutputPart *part_1;
  FrameBuffer *frameBuffer;
  OutputPart *part;
  int i_1;
  Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_> tiledFrameBuffers;
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> frameBuffers;
  vector<void_*,_std::allocator<void_*>_> parts;
  MultiPartOutputFile file;
  int b;
  int a;
  int i;
  int taskListSize;
  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
  taskList;
  vector<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_> outputfiles;
  Array2D<Imf_3_2::Array2D<unsigned_int>_> *tiledUintData;
  Array2D<Imf_3_2::Array2D<float>_> *tiledFloatData;
  Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *tiledHalfData;
  Array2D<unsigned_int> uintData;
  Array2D<float> floatData;
  Array2D<Imath_3_2::half> halfData;
  value_type *in_stack_fffffffffffffba8;
  Array2D<Imf_3_2::Array2D<float>_> *in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  Array2D<float> **ppAVar19;
  Array2D<Imf_3_2::FrameBuffer> *in_stack_fffffffffffffbc0;
  vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *in_stack_fffffffffffffbc8;
  Array2D<Imf_3_2::Array2D<float>_> *pAVar20;
  Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *in_stack_fffffffffffffbd0;
  Array2D<Imf_3_2::Array2D<float>_> *this_02;
  TaskGroup *in_stack_fffffffffffffbd8;
  WritingTask *in_stack_fffffffffffffbe0;
  Array2D<unsigned_int> **ppAVar21;
  Array2D<Imf_3_2::Array2D<unsigned_int>_> *local_410;
  vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *in_stack_fffffffffffffbf8;
  Array2D<Imf_3_2::Array2D<unsigned_int>_> *pAVar22;
  vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *in_stack_fffffffffffffc00;
  Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *pAVar23;
  long in_stack_fffffffffffffc08;
  Array2D<Imath_3_2::half> **ppAVar24;
  Array2D<Imf_3_2::FrameBuffer> *in_stack_fffffffffffffc10;
  Array2D<Imath_3_2::half> *pAVar25;
  long in_stack_fffffffffffffc30;
  long in_stack_fffffffffffffc38;
  Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *in_stack_fffffffffffffc40;
  value_type in_stack_fffffffffffffc8c;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffc90;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffc98;
  Array2D<float> *in_stack_fffffffffffffca0;
  Array2D<unsigned_int> *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb4;
  Array2D<Imf_3_2::Array2D<unsigned_int>_> *local_258;
  Array2D<Imf_3_2::Array2D<float>_> *local_220;
  Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *local_1e8;
  int local_1c0;
  int local_194;
  TaskGroup local_170 [8];
  FrameBuffer *local_168;
  undefined4 local_160;
  undefined4 local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  TiledOutputPart *local_148;
  TiledOutputPart *local_140;
  reference local_138;
  OutputPart *local_130;
  OutputPart *local_128;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> local_100;
  vector<void_*,_std::allocator<void_*>_> local_e8;
  MultiPartOutputFile local_d0 [16];
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
  local_b0 [2];
  Array2D<Imf_3_2::Array2D<unsigned_int>_> *local_80;
  Array2D<Imf_3_2::Array2D<float>_> *local_78;
  Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *local_70;
  Array2D<unsigned_int> local_68;
  Array2D<float> local_40;
  Array2D<Imath_3_2::half> local_28;
  int local_4;
  
  local_4 = in_EDI;
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D(&local_28);
  Imf_3_2::Array2D<float>::Array2D(&local_40);
  Imf_3_2::Array2D<unsigned_int>::Array2D(&local_68);
  fillPixels<unsigned_int>
            ((Array2D<unsigned_int> *)in_stack_fffffffffffffbc0,
             (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),(int)in_stack_fffffffffffffbb8);
  fillPixels<Imath_3_2::half>
            ((Array2D<Imath_3_2::half> *)in_stack_fffffffffffffbc0,
             (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),(int)in_stack_fffffffffffffbb8);
  fillPixels<float>((Array2D<float> *)in_stack_fffffffffffffbc0,
                    (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),(int)in_stack_fffffffffffffbb8);
  uVar8 = (ulong)local_4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar8;
  uVar9 = SUB168(auVar2 * ZEXT816(0x18),0);
  uVar18 = uVar9 + 8;
  if (0xfffffffffffffff7 < uVar9) {
    uVar18 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
    uVar18 = 0xffffffffffffffff;
  }
  puVar10 = (ulong *)operator_new__(uVar18);
  *puVar10 = uVar8;
  local_70 = (Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *)(puVar10 + 1);
  if (uVar8 != 0) {
    local_1e8 = local_70;
    do {
      Imf_3_2::Array2D<Imf_3_2::Array2D<Imath_3_2::half>_>::Array2D(local_1e8);
      local_1e8 = local_1e8 + 1;
    } while (local_1e8 != local_70 + uVar8);
  }
  uVar8 = (ulong)local_4;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar8;
  uVar9 = SUB168(auVar3 * ZEXT816(0x18),0);
  uVar18 = uVar9 + 8;
  if (0xfffffffffffffff7 < uVar9) {
    uVar18 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
    uVar18 = 0xffffffffffffffff;
  }
  puVar10 = (ulong *)operator_new__(uVar18);
  *puVar10 = uVar8;
  local_78 = (Array2D<Imf_3_2::Array2D<float>_> *)(puVar10 + 1);
  if (uVar8 != 0) {
    local_220 = local_78;
    do {
      Imf_3_2::Array2D<Imf_3_2::Array2D<float>_>::Array2D(local_220);
      local_220 = local_220 + 1;
    } while (local_220 != local_78 + uVar8);
  }
  uVar8 = (ulong)local_4;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar8;
  uVar9 = SUB168(auVar4 * ZEXT816(0x18),0);
  uVar18 = uVar9 + 8;
  if (0xfffffffffffffff7 < uVar9) {
    uVar18 = 0xffffffffffffffff;
  }
  if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
    uVar18 = 0xffffffffffffffff;
  }
  puVar10 = (ulong *)operator_new__(uVar18);
  *puVar10 = uVar8;
  local_80 = (Array2D<Imf_3_2::Array2D<unsigned_int>_> *)(puVar10 + 1);
  if (uVar8 != 0) {
    local_258 = local_80;
    do {
      Imf_3_2::Array2D<Imf_3_2::Array2D<unsigned_int>_>::Array2D(local_258);
      local_258 = local_258 + 1;
    } while (local_258 != local_80 + uVar8);
  }
  std::vector<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_>::vector
            ((vector<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_> *)
             0x1e9dbc);
  std::
  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
  ::vector((vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
            *)0x1e9dc9);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbd0,
             (size_type)in_stack_fffffffffffffbc8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbd0,
             (size_type)in_stack_fffffffffffffbc8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbd0,
             (size_type)in_stack_fffffffffffffbc8);
  poVar11 = std::operator<<((ostream *)&std::cout,"Generating headers and data ");
  std::ostream::operator<<(poVar11,std::flush<char,std::char_traits<char>>);
  generateRandomHeaders
            (in_stack_fffffffffffffef4,in_stack_fffffffffffffee8,
             (vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
              *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  poVar11 = std::operator<<((ostream *)&std::cout,"Shuffling ");
  sVar12 = std::
           vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
           ::size(local_b0);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,sVar12);
  poVar11 = std::operator<<(poVar11," tasks ");
  std::ostream::operator<<(poVar11,std::flush<char,std::char_traits<char>>);
  sVar12 = std::
           vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
           ::size(local_b0);
  local_b4 = (int)sVar12;
  for (local_b8 = 0; local_b8 < local_b4; local_b8 = local_b8 + 1) {
    local_bc = random_int((int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
    local_c0 = random_int((int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
    __a = std::
          vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
          ::operator[](local_b0,(long)local_bc);
    __b = std::
          vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
          ::operator[](local_b0,(long)local_c0);
    std::swap<(anonymous_namespace)::WritingTaskData>(__a,__b);
  }
  pcVar13 = (char *)std::__cxx11::string::c_str();
  remove(pcVar13);
  pcVar13 = (char *)std::__cxx11::string::c_str();
  pvVar14 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
                      ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                       (anonymous_namespace)::headers,0);
  sVar12 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::size
                     ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                      (anonymous_namespace)::headers);
  iVar7 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
            (local_d0,pcVar13,pvVar14,(int)sVar12,false,iVar7);
  poVar11 = std::operator<<((ostream *)&std::cout,"Writing tasks ");
  std::ostream::operator<<(poVar11,std::flush<char,std::char_traits<char>>);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)0x1ea262);
  std::allocator<Imf_3_2::FrameBuffer>::allocator((allocator<Imf_3_2::FrameBuffer> *)0x1ea287);
  std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::vector
            ((vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> *)
             in_stack_fffffffffffffbd0,(size_type)in_stack_fffffffffffffbc8,
             (allocator_type *)in_stack_fffffffffffffbc0);
  std::allocator<Imf_3_2::FrameBuffer>::~allocator((allocator<Imf_3_2::FrameBuffer> *)0x1ea2b3);
  Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_>::Array
            ((Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_> *)in_stack_fffffffffffffc10,
             in_stack_fffffffffffffc08);
  for (iVar7 = 0; iVar7 < local_4; iVar7 = iVar7 + 1) {
    pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::partTypes,
                         (long)iVar7);
    if (*pvVar15 == 0) {
      this = (OutputPart *)operator_new(8);
      Imf_3_2::OutputPart::OutputPart(this,local_d0,iVar7);
      local_130 = this;
      local_128 = this;
      std::vector<void_*,_std::allocator<void_*>_>::push_back
                ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffbb0,
                 in_stack_fffffffffffffba8);
      local_138 = std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::
                  operator[](&local_100,(long)iVar7);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,(long)iVar7)
      ;
      setOutputFrameBuffer
                ((FrameBuffer *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                 (Array2D<unsigned_int> *)in_stack_fffffffffffffca0,
                 (Array2D<float> *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                 in_stack_fffffffffffffc8c);
      Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)local_128);
    }
    else {
      this_00 = (TiledOutputPart *)operator_new(8);
      Imf_3_2::TiledOutputPart::TiledOutputPart(this_00,local_d0,iVar7);
      local_148 = this_00;
      local_140 = this_00;
      std::vector<void_*,_std::allocator<void_*>_>::push_back
                ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffbb0,
                 in_stack_fffffffffffffba8);
      local_14c = Imf_3_2::TiledOutputPart::numXLevels();
      local_150 = Imf_3_2::TiledOutputPart::numYLevels();
      Imf_3_2::Array2D<Imf_3_2::Array2D<unsigned_int>_>::resizeErase
                ((Array2D<Imf_3_2::Array2D<unsigned_int>_> *)in_stack_fffffffffffffc40,
                 in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
      Imf_3_2::Array2D<Imf_3_2::Array2D<float>_>::resizeErase
                ((Array2D<Imf_3_2::Array2D<float>_> *)in_stack_fffffffffffffc40,
                 in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
      Imf_3_2::Array2D<Imf_3_2::Array2D<Imath_3_2::half>_>::resizeErase
                (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
      Imf_3_2::Array::operator_cast_to_Array2D_((Array *)&stack0xfffffffffffffee8);
      Imf_3_2::Array2D<Imf_3_2::FrameBuffer>::resizeErase
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(long)in_stack_fffffffffffffc00
                );
      for (local_154 = 0; local_154 < local_14c; local_154 = local_154 + 1) {
        for (local_158 = 0; local_158 < local_150; local_158 = local_158 + 1) {
          bVar6 = Imf_3_2::TiledOutputPart::isValidLevel((int)local_140,local_154);
          if ((bVar6 & 1) != 0) {
            local_15c = Imf_3_2::TiledOutputPart::levelWidth((int)local_140);
            local_160 = Imf_3_2::TiledOutputPart::levelHeight((int)local_140);
            pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)&stack0xfffffffffffffee8);
            local_168 = Imf_3_2::Array2D<Imf_3_2::FrameBuffer>::operator[]
                                  (pAVar16 + iVar7,(long)local_158);
            local_168 = local_168 + local_154;
            pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 (anonymous_namespace)::pixelTypes,(long)iVar7);
            in_stack_fffffffffffffcb4 = *pvVar15;
            if (in_stack_fffffffffffffcb4 == 0) {
              in_stack_fffffffffffffca8 =
                   Imf_3_2::Array2D<Imf_3_2::Array2D<unsigned_int>_>::operator[]
                             (local_80 + iVar7,(long)local_158);
              fillPixels<unsigned_int>
                        ((Array2D<unsigned_int> *)in_stack_fffffffffffffbc0,
                         (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                         (int)in_stack_fffffffffffffbb8);
            }
            else if (in_stack_fffffffffffffcb4 == 1) {
              in_stack_fffffffffffffca0 =
                   Imf_3_2::Array2D<Imf_3_2::Array2D<float>_>::operator[]
                             (local_78 + iVar7,(long)local_158);
              fillPixels<float>((Array2D<float> *)in_stack_fffffffffffffbc0,
                                (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                                (int)in_stack_fffffffffffffbb8);
            }
            else if (in_stack_fffffffffffffcb4 == 2) {
              in_stack_fffffffffffffc98 =
                   Imf_3_2::Array2D<Imf_3_2::Array2D<Imath_3_2::half>_>::operator[]
                             (local_70 + iVar7,(long)local_158);
              fillPixels<Imath_3_2::half>
                        ((Array2D<Imath_3_2::half> *)in_stack_fffffffffffffbc0,
                         (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                         (int)in_stack_fffffffffffffbb8);
            }
            pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 (anonymous_namespace)::pixelTypes,(long)iVar7);
            in_stack_fffffffffffffc8c = *pvVar15;
            in_stack_fffffffffffffc90 =
                 (Array2D<Imath_3_2::half> *)
                 Imf_3_2::Array2D<Imf_3_2::Array2D<unsigned_int>_>::operator[]
                           (local_80 + iVar7,(long)local_158);
            Imf_3_2::Array2D<Imf_3_2::Array2D<float>_>::operator[](local_78 + iVar7,(long)local_158)
            ;
            Imf_3_2::Array2D<Imf_3_2::Array2D<Imath_3_2::half>_>::operator[]
                      (local_70 + iVar7,(long)local_158);
            setOutputFrameBuffer
                      ((FrameBuffer *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                       (Array2D<unsigned_int> *)in_stack_fffffffffffffca0,
                       (Array2D<float> *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                       in_stack_fffffffffffffc8c);
          }
        }
      }
    }
  }
  IlmThread_3_2::TaskGroup::TaskGroup(local_170);
  this_01 = (ThreadPool *)operator_new(0x10);
  IlmThread_3_2::ThreadPool::ThreadPool(this_01,0x20);
  std::
  vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  ::vector((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
            *)0x1eaaba);
  for (local_194 = 0; local_194 < local_b4; local_194 = local_194 + 1) {
    std::
    vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
    ::operator[](local_b0,(long)local_194);
    std::
    vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ::push_back((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                 *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    if ((local_194 % 10 == 0) || (local_194 == local_b4 + -1)) {
      operator_new(0x38);
      std::
      vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
      ::vector(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      Imf_3_2::Array::operator_cast_to_Array2D_((Array *)&stack0xfffffffffffffee8);
      WritingTask::WritingTask
                (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                 (MultiPartOutputFile *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                 in_stack_fffffffffffffbc0);
      IlmThread_3_2::ThreadPool::addTask((Task *)this_01);
      std::
      vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
      ::~vector((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                 *)in_stack_fffffffffffffbc0);
      std::
      vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
      ::clear((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
               *)0x1eabfc);
    }
  }
  for (local_1c0 = 0; local_1c0 < local_4; local_1c0 = local_1c0 + 1) {
    pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::partTypes,
                         (long)local_1c0);
    if (*pvVar15 == 0) {
      ppvVar17 = std::vector<void_*,_std::allocator<void_*>_>::operator[](&local_e8,(long)local_1c0)
      ;
      if (*ppvVar17 != (void *)0x0) {
        operator_delete(*ppvVar17,8);
      }
    }
    else {
      ppvVar17 = std::vector<void_*,_std::allocator<void_*>_>::operator[](&local_e8,(long)local_1c0)
      ;
      if (*ppvVar17 != (void *)0x0) {
        operator_delete(*ppvVar17,8);
      }
    }
  }
  if (this_01 != (ThreadPool *)0x0) {
    (**(code **)(*(long *)this_01 + 8))();
  }
  pAVar5 = local_70;
  if (local_70 != (Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *)0x0) {
    ppAVar24 = &local_70[-1]._data;
    pAVar25 = local_70[-1]._data;
    pAVar23 = local_70 + (long)pAVar25;
    while (pAVar5 != pAVar23) {
      pAVar23 = pAVar23 + -1;
      Imf_3_2::Array2D<Imf_3_2::Array2D<Imath_3_2::half>_>::~Array2D(in_stack_fffffffffffffbd0);
    }
    operator_delete__(ppAVar24,(long)pAVar25 * 0x18 + 8);
  }
  if (local_80 != (Array2D<Imf_3_2::Array2D<unsigned_int>_> *)0x0) {
    ppAVar21 = &local_80[-1]._data;
    pAVar1 = local_80[-1]._data;
    local_410 = local_80 + (long)pAVar1;
    pAVar22 = local_80;
    if (local_80 != local_410) {
      do {
        local_410 = local_410 + -1;
        Imf_3_2::Array2D<Imf_3_2::Array2D<unsigned_int>_>::~Array2D
                  ((Array2D<Imf_3_2::Array2D<unsigned_int>_> *)in_stack_fffffffffffffbd0);
      } while (local_410 != pAVar22);
    }
    operator_delete__(ppAVar21,(long)pAVar1 * 0x18 + 8);
  }
  this_02 = local_78;
  if (local_78 != (Array2D<Imf_3_2::Array2D<float>_> *)0x0) {
    ppAVar19 = &local_78[-1]._data;
    in_stack_fffffffffffffbc0 = (Array2D<Imf_3_2::FrameBuffer> *)local_78[-1]._data;
    pAVar20 = local_78 + (long)in_stack_fffffffffffffbc0;
    if (local_78 != local_78 + (long)in_stack_fffffffffffffbc0) {
      do {
        in_stack_fffffffffffffbb0 = pAVar20 + -1;
        Imf_3_2::Array2D<Imf_3_2::Array2D<float>_>::~Array2D(this_02);
        pAVar20 = in_stack_fffffffffffffbb0;
      } while (in_stack_fffffffffffffbb0 != this_02);
    }
    operator_delete__(ppAVar19,(long)in_stack_fffffffffffffbc0 * 0x18 + 8);
  }
  std::
  vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  ::~vector((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
             *)in_stack_fffffffffffffbc0);
  IlmThread_3_2::TaskGroup::~TaskGroup(local_170);
  Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_>::~Array
            ((Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_> *)this_02);
  std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::~vector
            ((vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> *)
             in_stack_fffffffffffffbc0);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffbc0);
  Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(local_d0);
  std::
  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
  ::~vector((vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
             *)in_stack_fffffffffffffbc0);
  std::vector<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_>::~vector
            ((vector<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_> *)
             in_stack_fffffffffffffbc0);
  Imf_3_2::Array2D<unsigned_int>::~Array2D((Array2D<unsigned_int> *)in_stack_fffffffffffffbb0);
  Imf_3_2::Array2D<float>::~Array2D((Array2D<float> *)in_stack_fffffffffffffbb0);
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)in_stack_fffffffffffffbb0)
  ;
  return;
}

Assistant:

void
generateRandomFile (int partCount, const std::string& srcFn)
{
    //
    // Init data.
    //
    Array2D<half>         halfData;
    Array2D<float>        floatData;
    Array2D<unsigned int> uintData;

    Array2D<unsigned int>  sampleCount;
    Array2D<half*>         deepHalfData;
    Array2D<float*>        deepFloatData;
    Array2D<unsigned int*> deepUintData;

    vector<GenericOutputFile*> outputfiles;

    pixelTypes.resize (partCount);
    partTypes.resize (partCount);
    levelModes.resize (partCount);

    //
    // Generate headers and data.
    //
    generateRandomHeaders (partCount, headers);

    remove (srcFn.c_str ());
    MultiPartOutputFile file (srcFn.c_str (), &headers[0], headers.size ());

    //
    // Writing files.
    //
    cout << "Writing files " << flush;

    //
    // Pre-generating frameBuffers.
    //
    for (int i = 0; i < partCount; i++)
    {
        switch (partTypes[i])
        {
            case 0: {
                OutputPart part (file, i);

                FrameBuffer frameBuffer;

                fillPixels<unsigned int> (uintData, width, height);
                fillPixels<float> (floatData, width, height);
                fillPixels<half> (halfData, width, height);

                setOutputFrameBuffer (
                    frameBuffer,
                    pixelTypes[i],
                    uintData,
                    floatData,
                    halfData,
                    width);

                part.setFrameBuffer (frameBuffer);

                part.writePixels (height);

                break;
            }
            case 1: {
                TiledOutputPart part (file, i);

                int numXLevels = part.numXLevels ();
                int numYLevels = part.numYLevels ();

                for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                    for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                    {
                        if (!part.isValidLevel (xLevel, yLevel)) continue;

                        int w = part.levelWidth (xLevel);
                        int h = part.levelHeight (yLevel);

                        FrameBuffer frameBuffer;

                        fillPixels<unsigned int> (uintData, w, h);
                        fillPixels<float> (floatData, w, h);
                        fillPixels<half> (halfData, w, h);
                        setOutputFrameBuffer (
                            frameBuffer,
                            pixelTypes[i],
                            uintData,
                            floatData,
                            halfData,
                            w);

                        part.setFrameBuffer (frameBuffer);

                        part.writeTiles (
                            0,
                            part.numXTiles (xLevel) - 1,
                            0,
                            part.numYTiles (yLevel) - 1,
                            xLevel,
                            yLevel);
                    }

                break;
            }
            case 2: {
                DeepScanLineOutputPart part (file, i);

                DeepFrameBuffer frameBuffer;

                sampleCount.resizeErase (height, width);
                for (int j = 0; j < height; j++)
                    for (int k = 0; k < width; k++)
                        sampleCount[j][k] = (j * width + k) % 10 + 1;

                frameBuffer.insertSampleCountSlice (Slice (
                    IMF::UINT,
                    (char*) (&sampleCount[0][0]),
                    sizeof (unsigned int) * 1,
                    sizeof (unsigned int) * width));

                if (pixelTypes[i] == 0)
                    fillPixels<unsigned int> (
                        sampleCount, deepUintData, width, height);
                if (pixelTypes[i] == 1)
                    fillPixels<float> (
                        sampleCount, deepFloatData, width, height);
                if (pixelTypes[i] == 2)
                    fillPixels<half> (sampleCount, deepHalfData, width, height);
                setOutputDeepFrameBuffer (
                    frameBuffer,
                    pixelTypes[i],
                    deepUintData,
                    deepFloatData,
                    deepHalfData,
                    width);

                part.setFrameBuffer (frameBuffer);

                part.writePixels (height);

                releasePixels (
                    pixelTypes[i],
                    deepUintData,
                    deepFloatData,
                    deepHalfData,
                    width,
                    height);

                break;
            }
            case 3: {
                DeepTiledOutputPart part (file, i);

                int numXLevels = part.numXLevels ();
                int numYLevels = part.numYLevels ();

                for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                    for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                    {
                        if (!part.isValidLevel (xLevel, yLevel)) continue;

                        int w = part.levelWidth (xLevel);
                        int h = part.levelHeight (yLevel);

                        DeepFrameBuffer frameBuffer;

                        sampleCount.resizeErase (h, w);
                        for (int j = 0; j < h; j++)
                            for (int k = 0; k < w; k++)
                                sampleCount[j][k] = (j * w + k) % 10 + 1;

                        frameBuffer.insertSampleCountSlice (Slice (
                            IMF::UINT,
                            (char*) (&sampleCount[0][0]),
                            sizeof (unsigned int) * 1,
                            sizeof (unsigned int) * w));

                        if (pixelTypes[i] == 0)
                            fillPixels<unsigned int> (
                                sampleCount, deepUintData, w, h);
                        if (pixelTypes[i] == 1)
                            fillPixels<float> (
                                sampleCount, deepFloatData, w, h);
                        if (pixelTypes[i] == 2)
                            fillPixels<half> (sampleCount, deepHalfData, w, h);
                        setOutputDeepFrameBuffer (
                            frameBuffer,
                            pixelTypes[i],
                            deepUintData,
                            deepFloatData,
                            deepHalfData,
                            w);

                        part.setFrameBuffer (frameBuffer);

                        part.writeTiles (
                            0,
                            part.numXTiles (xLevel) - 1,
                            0,
                            part.numYTiles (yLevel) - 1,
                            xLevel,
                            yLevel);

                        releasePixels (
                            pixelTypes[i],
                            deepUintData,
                            deepFloatData,
                            deepHalfData,
                            w,
                            h);
                    }

                break;
            }
        }
    }
}